

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# face.c
# Opt level: O3

bool_t prf_face_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint8_t uVar1;
  uint16_t uVar2;
  int16_t iVar3;
  ushort uVar4;
  int32_t iVar5;
  uint32_t uVar6;
  uint8_t *buffer;
  uint uVar7;
  uint len;
  bool_t bVar8;
  node_data_conflict1 *data;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  uVar2 = bf_get_uint16_be(bfile);
  node->length = uVar2;
  if (uVar2 < 0x2c) {
    prf_error(3,"face node too short (only %d bytes)");
LAB_001057b2:
    bVar8 = 0;
    bf_rewind(bfile,4);
  }
  else {
    buffer = node->data;
    if (buffer == (uint8_t *)0x0) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        buffer = (uint8_t *)malloc((ulong)(uVar2 - 4));
      }
      else {
        buffer = (uint8_t *)pool_malloc(pool_id,uVar2 - 4);
      }
      node->data = buffer;
      if (buffer == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        goto LAB_001057b2;
      }
    }
    bf_read(bfile,buffer,8);
    iVar5 = bf_get_int32_be(bfile);
    *(int32_t *)(buffer + 8) = iVar5;
    iVar3 = bf_get_int16_be(bfile);
    *(int16_t *)(buffer + 0xc) = iVar3;
    uVar1 = bf_get_int8(bfile);
    buffer[0xe] = uVar1;
    uVar1 = bf_get_int8(bfile);
    buffer[0xf] = uVar1;
    uVar2 = bf_get_uint16_be(bfile);
    *(uint16_t *)(buffer + 0x10) = uVar2;
    uVar2 = bf_get_uint16_be(bfile);
    *(uint16_t *)(buffer + 0x12) = uVar2;
    uVar1 = bf_get_int8(bfile);
    buffer[0x14] = uVar1;
    uVar1 = bf_get_int8(bfile);
    buffer[0x15] = uVar1;
    iVar3 = bf_get_int16_be(bfile);
    *(int16_t *)(buffer + 0x16) = iVar3;
    iVar3 = bf_get_int16_be(bfile);
    *(int16_t *)(buffer + 0x18) = iVar3;
    iVar3 = bf_get_int16_be(bfile);
    *(int16_t *)(buffer + 0x1a) = iVar3;
    iVar3 = bf_get_int16_be(bfile);
    *(int16_t *)(buffer + 0x1c) = iVar3;
    iVar3 = bf_get_int16_be(bfile);
    *(int16_t *)(buffer + 0x1e) = iVar3;
    iVar5 = bf_get_int32_be(bfile);
    *(int32_t *)(buffer + 0x20) = iVar5;
    uVar2 = bf_get_uint16_be(bfile);
    *(uint16_t *)(buffer + 0x24) = uVar2;
    uVar1 = bf_get_uint8(bfile);
    buffer[0x26] = uVar1;
    uVar1 = bf_get_uint8(bfile);
    buffer[0x27] = uVar1;
    uVar4 = node->length;
    uVar7 = 0x2c;
    if (0x2f < uVar4) {
      uVar6 = bf_get_uint32_be(bfile);
      *(uint32_t *)(buffer + 0x28) = uVar6;
      uVar4 = node->length;
      uVar7 = 0x30;
      if (0x30 < uVar4) {
        uVar1 = bf_get_uint8(bfile);
        buffer[0x2c] = uVar1;
        uVar4 = node->length;
        uVar7 = 0x31;
        if (0x31 < uVar4) {
          uVar1 = bf_get_uint8(bfile);
          buffer[0x2d] = uVar1;
          uVar4 = node->length;
          uVar7 = 0x32;
          if (0x33 < uVar4) {
            uVar2 = bf_get_uint16_be(bfile);
            *(uint16_t *)(buffer + 0x2e) = uVar2;
            uVar4 = node->length;
            uVar7 = 0x34;
            if (0x37 < uVar4) {
              uVar6 = bf_get_uint32_be(bfile);
              *(uint32_t *)(buffer + 0x30) = uVar6;
              uVar4 = node->length;
              uVar7 = 0x38;
              if (0x3b < uVar4) {
                uVar6 = bf_get_uint32_be(bfile);
                *(uint32_t *)(buffer + 0x34) = uVar6;
                uVar4 = node->length;
                uVar7 = 0x3c;
                if (0x3f < uVar4) {
                  uVar6 = bf_get_uint32_be(bfile);
                  *(uint32_t *)(buffer + 0x38) = uVar6;
                  uVar4 = node->length;
                  uVar7 = 0x40;
                  if (0x41 < uVar4) {
                    iVar3 = bf_get_int16_be(bfile);
                    *(int16_t *)(buffer + 0x3c) = iVar3;
                    uVar4 = node->length;
                    uVar7 = 0x42;
                    if (0x43 < uVar4) {
                      iVar3 = bf_get_int16_be(bfile);
                      *(int16_t *)(buffer + 0x3e) = iVar3;
                      uVar4 = node->length;
                      uVar7 = 0x44;
                      if (0x47 < uVar4) {
                        uVar6 = bf_get_uint32_be(bfile);
                        *(uint32_t *)(buffer + 0x40) = uVar6;
                        uVar4 = node->length;
                        uVar7 = 0x48;
                        if (0x4b < uVar4) {
                          uVar6 = bf_get_uint32_be(bfile);
                          *(uint32_t *)(buffer + 0x44) = uVar6;
                          uVar4 = node->length;
                          uVar7 = 0x4c;
                          if (0x4d < uVar4) {
                            iVar3 = bf_get_int16_be(bfile);
                            *(int16_t *)(buffer + 0x48) = iVar3;
                            uVar4 = node->length;
                            uVar7 = 0x4e;
                            if (0x4f < uVar4) {
                              iVar3 = bf_get_int16_be(bfile);
                              *(int16_t *)(buffer + 0x4a) = iVar3;
                              uVar4 = node->length;
                              uVar7 = 0x50;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar8 = 1;
    len = uVar4 - uVar7;
    if (uVar7 <= uVar4 && len != 0) {
      bf_read(bfile,node->data + ((ulong)uVar7 - 4),len);
    }
  }
  return bVar8;
}

Assistant:

static
bool_t
prf_face_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );
 
    node->opcode = bf_get_uint16_be( bfile );
    assert( node->opcode == prf_face_info.opcode );

    node->length = bf_get_uint16_be( bfile );
    if ( node->length < 44 ) {
        prf_error( 3, "face node too short (only %d bytes)", node->length );
        bf_rewind( bfile, 4 );
        return FALSE;
    }

    if ( node->length > 4 && node->data == NULL ) { /* not pre-allocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        bf_read( bfile, (uint8_t *) data->ascii_id, 8 ); pos += 8;
        data->ir_color_code = bf_get_int32_be( bfile ); pos += 4;
        data->relative_priority = bf_get_int16_be( bfile ); pos += 2;
        data->draw_type = bf_get_int8( bfile ); pos += 1;
        data->texture_white = bf_get_int8( bfile ); pos += 1;
        data->color_name_index = bf_get_uint16_be( bfile ); pos += 2;
        data->alternate_color_name_index = bf_get_uint16_be( bfile ); pos += 2;
        data->reserved1 = bf_get_int8( bfile ); pos += 1;
        data->billboard_flags = bf_get_int8( bfile ); pos += 1;
        data->detail_texture_pattern_index = bf_get_int16_be( bfile ); pos += 2;
        data->texture_pattern_index = bf_get_int16_be( bfile ); pos += 2;
        data->material_index = bf_get_int16_be( bfile ); pos += 2;
        data->surface_material_code = bf_get_int16_be( bfile ); pos += 2;
        data->feature_id = bf_get_int16_be( bfile ); pos += 2;
        data->ir_material_code = bf_get_int32_be( bfile ); pos += 4;
        data->transparency = bf_get_uint16_be( bfile ); pos += 2;
        data->lod_generation_control = bf_get_uint8( bfile ); pos += 1;
        data->line_style_index = bf_get_uint8( bfile ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 1) ) break;
        data->light_mode = bf_get_uint8( bfile ); pos += 1;
        if ( node->length < (pos + 1) ) break;
        data->reserved2 = bf_get_uint8( bfile ); pos += 1;
        if ( node->length < (pos + 2) ) break;
        data->reserved3 = bf_get_uint16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->reserved4 = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->packed_color_primary = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->packed_color_alternate = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->texture_mapping_index = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved5 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->primary_color_index = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->alternate_color_index = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->reserved6 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved7 = bf_get_int16_be( bfile ); pos += 2;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}